

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

void Llb_Nonlin4SweepDeref(DdManager *dd,Vec_Ptr_t *vParts)

{
  DdNode *n;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vParts->nSize; i_00 = i_00 + 1) {
    n = (DdNode *)Vec_PtrEntry(vParts,i_00);
    Cudd_RecursiveDeref(dd,n);
  }
  free(vParts->pArray);
  free(vParts);
  return;
}

Assistant:

void Llb_Nonlin4SweepDeref( DdManager * dd, Vec_Ptr_t * vParts )
{
    DdNode * bFunc;
    int i;
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vParts );
}